

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomHeap.h
# Opt level: O3

BOOL __thiscall
Memory::CustomHeap::
CodePageAllocators<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>::
ProtectPages(CodePageAllocators<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>
             *this,char *address,size_t pageCount,void *segment,DWORD dwVirtualProtectFlags,
            DWORD desiredOldProtectFlag)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  HeapPageAllocator<Memory::PreReservedVirtualAllocWrapper> *this_00;
  undefined4 *puVar4;
  HeapPageAllocator<Memory::VirtualAllocWrapper> *this_01;
  
  if (segment == (void *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/CustomHeap.h"
                       ,0xf9,"(segment)","segment");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
    bVar2 = IsPreReservedSegment(this,(void *)0x0);
  }
  else {
    bVar2 = SegmentBaseCommon::IsInPreReservedHeapPageAllocator((SegmentBaseCommon *)segment);
  }
  if (bVar2) {
    this_00 = GetPreReservedPageAllocator(this,segment);
    BVar3 = HeapPageAllocator<Memory::PreReservedVirtualAllocWrapper>::ProtectPages
                      (this_00,address,pageCount,segment,dwVirtualProtectFlags,desiredOldProtectFlag
                      );
    return BVar3;
  }
  this_01 = GetPageAllocator(this,segment);
  BVar3 = HeapPageAllocator<Memory::VirtualAllocWrapper>::ProtectPages
                    (this_01,address,pageCount,segment,dwVirtualProtectFlags,desiredOldProtectFlag);
  return BVar3;
}

Assistant:

BOOL ProtectPages(__in char* address, size_t pageCount, __in void* segment, DWORD dwVirtualProtectFlags, DWORD desiredOldProtectFlag)
    {
        // This is merely a wrapper for VirtualProtect, no need to synchornize, and doesn't touch any data.
        // No need to assert locked.
        Assert(segment);
        if (IsPreReservedSegment(segment))
        {
            return this->GetPreReservedPageAllocator(segment)->ProtectPages(address, pageCount, segment, dwVirtualProtectFlags, desiredOldProtectFlag);
        }
        else
        {
            return this->GetPageAllocator(segment)->ProtectPages(address, pageCount, segment, dwVirtualProtectFlags, desiredOldProtectFlag);
        }
    }